

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_CreateTest_InvalidValueOnNullParams_Test::TestBody
          (ktxTexture1_CreateTest_InvalidValueOnNullParams_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ktxTexture *texture;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int iVar4;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined8 in_stack_fffffffffffffec8;
  Type type;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult *this_02;
  Message *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertionResult local_d0 [2];
  undefined4 local_b0;
  undefined4 local_ac;
  AssertionResult local_a8 [2];
  undefined4 local_88;
  undefined4 local_84;
  AssertionResult local_80 [2];
  undefined4 local_60;
  undefined4 local_5c;
  AssertionResult local_58 [3];
  undefined4 local_28;
  undefined4 local_24;
  AssertionResult local_20;
  undefined8 local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_10[0] = 0;
  local_24 = ktxTexture_CreateFromStdioStream(0,0,local_10);
  local_28 = 0xb;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             (ktx_error_code_e *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (ktx_error_code_e *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    testing::AssertionResult::failure_message((AssertionResult *)0x128bef);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffed0,type,
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x128c4c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128ca1);
  local_5c = ktxTexture_CreateFromNamedFile(0,0,local_10);
  local_60 = 0xb;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             (ktx_error_code_e *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (ktx_error_code_e *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    testing::AssertionResult::failure_message((AssertionResult *)0x128d5a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffed0,type,
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x128db7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128e0f);
  local_84 = ktxTexture_CreateFromMemory(0,0,0,local_10);
  local_88 = 0xb;
  this_02 = local_80;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             (ktx_error_code_e *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (ktx_error_code_e *)in_stack_fffffffffffffea0);
  iVar4 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x128ecb);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),iVar4,
               in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x128f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128f7d);
  local_ac = ktxTexture_CreateFromNamedFile("foo",0,0);
  local_b0 = 0xb;
  this_01 = local_a8;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffeb0,
             (ktx_error_code_e *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (ktx_error_code_e *)in_stack_fffffffffffffea0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_02);
    in_stack_fffffffffffffeb0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x129035);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar2,in_stack_fffffffffffffec0),
               (int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x129092);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1290ea);
  ktxTexture_CreateFromMemory(*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),0,0);
  this_00 = local_d0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffeb0,
             (ktx_error_code_e *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (ktx_error_code_e *)this_00);
  iVar4 = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0x1291ae);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar2,in_stack_fffffffffffffec0),iVar4,
               in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x129209);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12925e);
  return;
}

Assistant:

TEST_F(ktxTexture1_CreateTest, InvalidValueOnNullParams) {
    ktxTexture* texture = 0;

    EXPECT_EQ(ktxTexture_CreateFromStdioStream(0, 0, &texture),
              KTX_INVALID_VALUE);
    EXPECT_EQ(ktxTexture_CreateFromNamedFile(0, 0, &texture),
              KTX_INVALID_VALUE);
    EXPECT_EQ(ktxTexture_CreateFromMemory(0, 0, 0, &texture),
              KTX_INVALID_VALUE);
    //EXPECT_EQ(ktxTexture_CreateFromStdioStream(0, 0, 0),
    //          KTX_INVALID_VALUE);
    EXPECT_EQ(ktxTexture_CreateFromNamedFile("foo", 0, 0),
              KTX_INVALID_VALUE);
    EXPECT_EQ(ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen, 0, 0),
              KTX_INVALID_VALUE);
}